

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiContext::ImGuiContext(ImGuiContext *this,ImFontAtlas *shared_font_atlas)

{
  void *pvVar1;
  void *in_RSI;
  undefined1 *in_RDI;
  ImFontAtlas *this_00;
  ImGuiNextWindowData *in_stack_fffffffffffffe30;
  void *local_1c8;
  ImPool<ImGuiTable> *in_stack_fffffffffffffe40;
  ImGuiInputTextState *in_stack_fffffffffffffe50;
  ImGuiIO *in_stack_fffffffffffffe80;
  ImGuiStyle *in_stack_fffffffffffffea0;
  ImGuiKeyOwnerData *local_a8;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  undefined1 local_31;
  void *local_30;
  void *local_28;
  void *local_10;
  
  local_10 = in_RSI;
  ImGuiIO::ImGuiIO(in_stack_fffffffffffffe80);
  ImVector<ImGuiInputEvent>::ImVector((ImVector<ImGuiInputEvent> *)(in_RDI + 0x37c0));
  ImVector<ImGuiInputEvent>::ImVector((ImVector<ImGuiInputEvent> *)(in_RDI + 0x37d0));
  ImGuiStyle::ImGuiStyle(in_stack_fffffffffffffea0);
  ImDrawListSharedData::ImDrawListSharedData((ImDrawListSharedData *)in_stack_fffffffffffffe80);
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e40));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e50));
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x3e60));
  ImVector<ImGuiWindowStackData>::ImVector((ImVector<ImGuiWindowStackData> *)(in_RDI + 0x3e70));
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x50825c);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x3e94));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x3ec8));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x3f00));
  local_a8 = (ImGuiKeyOwnerData *)(in_RDI + 0x3f30);
  do {
    ImGuiKeyOwnerData::ImGuiKeyOwnerData(local_a8);
    local_a8 = local_a8 + 1;
  } while (local_a8 != (ImGuiKeyOwnerData *)(in_RDI + 0x45c0));
  ImGuiKeyRoutingTable::ImGuiKeyRoutingTable((ImGuiKeyRoutingTable *)in_stack_fffffffffffffe50);
  ImGuiNextItemData::ImGuiNextItemData((ImGuiNextItemData *)0x508332);
  ImGuiLastItemData::ImGuiLastItemData((ImGuiLastItemData *)in_stack_fffffffffffffe30);
  ImGuiNextWindowData::ImGuiNextWindowData(in_stack_fffffffffffffe30);
  ImVector<ImGuiColorMod>::ImVector((ImVector<ImGuiColorMod> *)(in_RDI + 0x47d0));
  ImVector<ImGuiStyleMod>::ImVector((ImVector<ImGuiStyleMod> *)(in_RDI + 0x47e0));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)(in_RDI + 0x47f0));
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)(in_RDI + 0x4800));
  ImVector<int>::ImVector((ImVector<int> *)(in_RDI + 0x4810));
  ImVector<ImGuiGroupData>::ImVector((ImVector<ImGuiGroupData> *)(in_RDI + 0x4820));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x4830));
  ImVector<ImGuiPopupData>::ImVector((ImVector<ImGuiPopupData> *)(in_RDI + 0x4840));
  ImVector<ImGuiViewportP_*>::ImVector((ImVector<ImGuiViewportP_*> *)(in_RDI + 0x4858));
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe30);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe30);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe30);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe30);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe30);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe30);
  ImGuiNavItemData::ImGuiNavItemData((ImGuiNavItemData *)in_stack_fffffffffffffe30);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x49fc));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x4a04));
  ImGuiPayload::ImGuiPayload((ImGuiPayload *)0x508548);
  ImRect::ImRect((ImRect *)in_stack_fffffffffffffe30);
  ImVector<unsigned_char>::ImVector((ImVector<unsigned_char> *)(in_RDI + 0x4a98));
  ImVector<ImGuiListClipperData>::ImVector((ImVector<ImGuiListClipperData> *)(in_RDI + 0x4ac0));
  ImVector<ImGuiTableTempData>::ImVector((ImVector<ImGuiTableTempData> *)(in_RDI + 0x4ae0));
  ImPool<ImGuiTable>::ImPool(in_stack_fffffffffffffe40);
  ImVector<float>::ImVector((ImVector<float> *)(in_RDI + 0x4b18));
  ImVector<ImDrawChannel>::ImVector((ImVector<ImDrawChannel> *)(in_RDI + 0x4b28));
  ImPool<ImGuiTabBar>::ImPool((ImPool<ImGuiTabBar> *)in_stack_fffffffffffffe40);
  ImVector<ImGuiPtrOrIndex>::ImVector((ImVector<ImGuiPtrOrIndex> *)(in_RDI + 0x4b68));
  ImVector<ImGuiShrinkWidthItem>::ImVector((ImVector<ImGuiShrinkWidthItem> *)(in_RDI + 0x4b78));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x4b98));
  ImGuiInputTextState::ImGuiInputTextState(in_stack_fffffffffffffe50);
  ImFont::ImFont((ImFont *)in_stack_fffffffffffffe50);
  ImVec4::ImVec4((ImVec4 *)(in_RDI + 0x5aac));
  ImGuiComboPreviewData::ImGuiComboPreviewData((ImGuiComboPreviewData *)in_stack_fffffffffffffe30);
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x5b10));
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)(in_RDI + 0x5b20));
  ImGuiPlatformImeData::ImGuiPlatformImeData((ImGuiPlatformImeData *)in_stack_fffffffffffffe30);
  ImGuiPlatformImeData::ImGuiPlatformImeData((ImGuiPlatformImeData *)in_stack_fffffffffffffe30);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x508764);
  ImVector<ImGuiSettingsHandler>::ImVector((ImVector<ImGuiSettingsHandler> *)(in_RDI + 0x5b68));
  ImChunkStream<ImGuiWindowSettings>::ImChunkStream((ImChunkStream<ImGuiWindowSettings> *)0x50879a);
  this_00 = (ImFontAtlas *)(in_RDI + 0x5b88);
  ImChunkStream<ImGuiTableSettings>::ImChunkStream((ImChunkStream<ImGuiTableSettings> *)0x5087b5);
  ImVector<ImGuiContextHook>::ImVector((ImVector<ImGuiContextHook> *)(in_RDI + 0x5b98));
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x5087eb);
  ImGuiTextBuffer::ImGuiTextBuffer((ImGuiTextBuffer *)0x508806);
  ImGuiTextIndex::ImGuiTextIndex((ImGuiTextIndex *)in_stack_fffffffffffffe30);
  ImGuiMetricsConfig::ImGuiMetricsConfig((ImGuiMetricsConfig *)(in_RDI + 0x5c60));
  ImGuiStackTool::ImGuiStackTool((ImGuiStackTool *)in_stack_fffffffffffffe30);
  ImVector<char>::ImVector((ImVector<char> *)(in_RDI + 0x5da0));
  *in_RDI = 0;
  in_RDI[1] = -(local_10 == (void *)0x0) & 1;
  *(undefined8 *)(in_RDI + 0x3bf8) = 0;
  *(undefined4 *)(in_RDI + 0x3c04) = 0;
  *(undefined4 *)(in_RDI + 0x3c00) = 0;
  local_31 = 0;
  if (local_10 == (void *)0x0) {
    pvVar1 = ImGui::MemAlloc((size_t)in_stack_fffffffffffffe30);
    local_1c8 = ::operator_new(0x490);
    local_31 = 1;
    local_30 = pvVar1;
    local_28 = local_1c8;
    ImFontAtlas::ImFontAtlas(this_00);
  }
  else {
    local_1c8 = local_10;
  }
  *(void **)(in_RDI + 0x58) = local_1c8;
  *(undefined8 *)(in_RDI + 0x3e18) = 0;
  *(undefined4 *)(in_RDI + 0x3e20) = 0;
  *(undefined4 *)(in_RDI + 0x3e28) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3e24) = 0xffffffff;
  in_RDI[0x3e2e] = 0;
  in_RDI[0x3e2d] = 0;
  in_RDI[0x3e2c] = 0;
  in_RDI[0x3e2f] = 0;
  in_RDI[0x3e30] = 0;
  *(undefined8 *)(in_RDI + 0x3e38) = 0;
  *(undefined4 *)(in_RDI + 0x3e90) = 0;
  *(undefined8 *)(in_RDI + 0x3ea0) = 0;
  *(undefined8 *)(in_RDI + 0x3ea8) = 0;
  *(undefined8 *)(in_RDI + 0x3eb0) = 0;
  *(undefined8 *)(in_RDI + 0x3eb8) = 0;
  *(undefined8 *)(in_RDI + 0x3ec0) = 0;
  *(undefined4 *)(in_RDI + 0x3ed0) = 0;
  *(undefined4 *)(in_RDI + 0x3ed4) = 0;
  *(undefined4 *)(in_RDI + 0x3edc) = 0;
  *(undefined4 *)(in_RDI + 0x3ed8) = 0;
  in_RDI[0x3ee0] = 0;
  in_RDI[0x3ee1] = 0;
  *(undefined4 *)(in_RDI + 0x3ee8) = 0;
  *(undefined4 *)(in_RDI + 0x3ee4) = 0;
  *(undefined4 *)(in_RDI + 0x3eec) = 0;
  *(undefined4 *)(in_RDI + 0x3ef0) = 0;
  *(undefined4 *)(in_RDI + 0x3ef4) = 0;
  in_RDI[0x3ef8] = 0;
  in_RDI[0x3ef9] = 0;
  in_RDI[0x3efa] = 0;
  in_RDI[0x3efb] = 0;
  in_RDI[0x3efc] = 0;
  in_RDI[0x3efd] = 0;
  ImVec2::ImVec2(&local_3c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x3f00) = local_3c;
  *(undefined8 *)(in_RDI + 0x3f08) = 0;
  *(undefined4 *)(in_RDI + 0x3f10) = 0;
  *(undefined4 *)(in_RDI + 0x3f14) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x3f18) = 0;
  in_RDI[0x3f1c] = 0;
  in_RDI[0x3f1d] = 0;
  *(undefined8 *)(in_RDI + 0x3f20) = 0;
  *(undefined4 *)(in_RDI + 0x3f28) = 0;
  *(undefined4 *)(in_RDI + 0x3f2c) = 0;
  *(undefined4 *)(in_RDI + 0x46f8) = 0;
  in_RDI[0x46fc] = 0;
  *(undefined4 *)(in_RDI + 0x4700) = 0;
  *(undefined4 *)(in_RDI + 0x4704) = 0;
  *(undefined4 *)(in_RDI + 0x4708) = 0;
  *(undefined4 *)(in_RDI + 0x4850) = 0;
  *(undefined8 *)(in_RDI + 0x4868) = 0;
  *(undefined4 *)(in_RDI + 0x4884) = 0;
  *(undefined4 *)(in_RDI + 0x4880) = 0;
  *(undefined4 *)(in_RDI + 0x487c) = 0;
  *(undefined4 *)(in_RDI + 0x4878) = 0;
  *(undefined4 *)(in_RDI + 0x4874) = 0;
  *(undefined4 *)(in_RDI + 0x4870) = 0;
  *(undefined4 *)(in_RDI + 0x4898) = 0;
  *(undefined4 *)(in_RDI + 0x4890) = 0;
  *(undefined4 *)(in_RDI + 0x488c) = 0;
  *(undefined4 *)(in_RDI + 0x489c) = 0;
  *(undefined4 *)(in_RDI + 0x4888) = 0;
  *(undefined4 *)(in_RDI + 0x4894) = 0;
  *(undefined4 *)(in_RDI + 0x48a0) = 0;
  *(undefined4 *)(in_RDI + 0x48a4) = 0;
  in_RDI[0x48a8] = 0;
  in_RDI[0x48a9] = 0;
  in_RDI[0x48aa] = 1;
  in_RDI[0x48ab] = 0;
  in_RDI[0x48ac] = 0;
  in_RDI[0x48ad] = 0;
  in_RDI[0x48ae] = 0;
  *(undefined4 *)(in_RDI + 0x48b0) = 0;
  in_RDI[0x48c4] = 0;
  in_RDI[0x48c5] = 0;
  in_RDI[0x48c6] = 0;
  *(undefined4 *)(in_RDI + 0x48c8) = 0;
  *(undefined4 *)(in_RDI + 0x48cc) = 0;
  *(undefined4 *)(in_RDI + 0x48d0) = 0;
  *(undefined4 *)(in_RDI + 0x48dc) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x48d8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x48d4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4900) = 0;
  *(undefined4 *)(in_RDI + 0x4904) = 0;
  *(undefined4 *)(in_RDI + 0x4908) = 0;
  *(undefined4 *)(in_RDI + 0x49d0) = 0x1200;
  *(undefined4 *)(in_RDI + 0x49d4) = 0x3200;
  *(undefined8 *)(in_RDI + 0x49e8) = 0;
  *(undefined8 *)(in_RDI + 0x49e0) = 0;
  *(undefined8 *)(in_RDI + 0x49d8) = 0;
  *(undefined4 *)(in_RDI + 0x49f4) = 0;
  *(undefined4 *)(in_RDI + 0x49f0) = 0;
  in_RDI[0x49f8] = 0;
  *(undefined4 *)(in_RDI + 0x4a0c) = 0;
  *(undefined4 *)(in_RDI + 0x4a10) = 0;
  in_RDI[0x4a16] = 0;
  in_RDI[0x4a15] = 0;
  in_RDI[0x4a14] = 0;
  *(undefined4 *)(in_RDI + 0x4a18) = 0;
  *(undefined4 *)(in_RDI + 0x4a1c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4a20) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4a78) = 0;
  *(undefined4 *)(in_RDI + 0x4a7c) = 0;
  *(undefined4 *)(in_RDI + 0x4a80) = 0;
  *(undefined4 *)(in_RDI + 0x4a84) = 0;
  *(undefined4 *)(in_RDI + 0x4a88) = 0;
  *(undefined4 *)(in_RDI + 0x4a8c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4a90) = 0;
  *(undefined8 *)(in_RDI + 0x4aa8) = 0;
  *(undefined8 *)(in_RDI + 0x4ab0) = 0;
  *(undefined4 *)(in_RDI + 0x4ab8) = 0;
  *(undefined8 *)(in_RDI + 0x4ad0) = 0;
  *(undefined4 *)(in_RDI + 0x4ad8) = 0;
  *(undefined8 *)(in_RDI + 0x4b38) = 0;
  *(undefined4 *)(in_RDI + 0x4b8c) = 0;
  *(undefined4 *)(in_RDI + 0x4b88) = 0;
  *(undefined4 *)(in_RDI + 0x4b94) = 0;
  *(undefined4 *)(in_RDI + 0x4b90) = 0;
  *(undefined4 *)(in_RDI + 0x5a98) = 0;
  *(undefined4 *)(in_RDI + 0x5a9c) = 0xa900000;
  *(undefined4 *)(in_RDI + 0x5aa4) = 0;
  *(undefined4 *)(in_RDI + 0x5aa0) = 0;
  *(undefined4 *)(in_RDI + 0x5aa8) = 0;
  *(undefined4 *)(in_RDI + 0x5aec) = 0;
  *(undefined4 *)(in_RDI + 0x5af0) = 0;
  in_RDI[0x5af4] = 0;
  in_RDI[0x5af5] = 0;
  *(undefined4 *)(in_RDI + 0x5af8) = 0;
  *(undefined4 *)(in_RDI + 0x5afc) = 0x3c23d70a;
  *(undefined4 *)(in_RDI + 0x5b00) = 0;
  *(undefined4 *)(in_RDI + 0x5b04) = 0;
  *(undefined2 *)(in_RDI + 0x5b08) = 0;
  *(undefined2 *)(in_RDI + 0x5b0a) = 0;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x5b34) = local_44;
  ImVec2::ImVec2(&local_4c,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 0x5b44) = local_4c;
  in_RDI[0x5b50] = 0x2e;
  in_RDI[0x5b51] = 0;
  *(undefined4 *)(in_RDI + 0x5b54) = 0;
  *(undefined4 *)(in_RDI + 0x5ba8) = 0;
  memset(in_RDI + 0x5bb0,0,0x38);
  in_RDI[0x5be8] = 0;
  *(undefined4 *)(in_RDI + 0x5bec) = 0;
  *(undefined8 *)(in_RDI + 0x5c10) = 0;
  *(undefined8 *)(in_RDI + 0x5c08) = 0;
  *(undefined8 *)(in_RDI + 0x5bf0) = 0;
  *(undefined4 *)(in_RDI + 0x5c18) = 0x7f7fffff;
  in_RDI[0x5c1c] = 0;
  *(undefined4 *)(in_RDI + 0x5c20) = 0;
  *(undefined4 *)(in_RDI + 0x5c28) = 2;
  *(undefined4 *)(in_RDI + 0x5c24) = 2;
  *(undefined4 *)(in_RDI + 0x5c2c) = 0x400;
  *(undefined4 *)(in_RDI + 0x470c) = 0;
  in_RDI[0x5c58] = 0;
  in_RDI[0x5c59] = 0;
  in_RDI[0x5c5a] = 0;
  *(undefined4 *)(in_RDI + 0x5c5c) = 0;
  memset(in_RDI + 0x5c98,0,0xf0);
  *(undefined4 *)(in_RDI + 0x5d8c) = 0;
  *(undefined4 *)(in_RDI + 0x5d88) = 0;
  *(undefined4 *)(in_RDI + 0x5d90) = 0;
  *(undefined4 *)(in_RDI + 0x5d9c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x5d98) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x5d94) = 0xffffffff;
  return;
}

Assistant:

ImGuiContext(ImFontAtlas* shared_font_atlas)
    {
        Initialized = false;
        FontAtlasOwnedByContext = shared_font_atlas ? false : true;
        Font = NULL;
        FontSize = FontBaseSize = 0.0f;
        IO.Fonts = shared_font_atlas ? shared_font_atlas : IM_NEW(ImFontAtlas)();
        Time = 0.0f;
        FrameCount = 0;
        FrameCountEnded = FrameCountRendered = -1;
        WithinFrameScope = WithinFrameScopeWithImplicitWindow = WithinEndChild = false;
        GcCompactAll = false;
        TestEngineHookItems = false;
        TestEngine = NULL;

        WindowsActiveCount = 0;
        CurrentWindow = NULL;
        HoveredWindow = NULL;
        HoveredWindowUnderMovingWindow = NULL;
        MovingWindow = NULL;
        WheelingWindow = NULL;
        WheelingWindowReleaseTimer = 0.0f;

        DebugHookIdInfo = 0;
        HoveredId = HoveredIdPreviousFrame = 0;
        HoveredIdAllowOverlap = false;
        HoveredIdDisabled = false;
        HoveredIdTimer = HoveredIdNotActiveTimer = 0.0f;
        ActiveId = 0;
        ActiveIdIsAlive = 0;
        ActiveIdTimer = 0.0f;
        ActiveIdIsJustActivated = false;
        ActiveIdAllowOverlap = false;
        ActiveIdNoClearOnFocusLoss = false;
        ActiveIdHasBeenPressedBefore = false;
        ActiveIdHasBeenEditedBefore = false;
        ActiveIdHasBeenEditedThisFrame = false;
        ActiveIdClickOffset = ImVec2(-1, -1);
        ActiveIdWindow = NULL;
        ActiveIdSource = ImGuiInputSource_None;
        ActiveIdMouseButton = -1;
        ActiveIdPreviousFrame = 0;
        ActiveIdPreviousFrameIsAlive = false;
        ActiveIdPreviousFrameHasBeenEditedBefore = false;
        ActiveIdPreviousFrameWindow = NULL;
        LastActiveId = 0;
        LastActiveIdTimer = 0.0f;

        ActiveIdUsingNavDirMask = 0x00;
        ActiveIdUsingAllKeyboardKeys = false;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
        ActiveIdUsingNavInputMask = 0x00;
#endif

        CurrentFocusScopeId = 0;
        CurrentItemFlags = ImGuiItemFlags_None;
        BeginMenuCount = 0;

        NavWindow = NULL;
        NavId = NavFocusScopeId = NavActivateId = NavActivateDownId = NavActivatePressedId = NavActivateInputId = 0;
        NavJustMovedToId = NavJustMovedToFocusScopeId = NavNextActivateId = 0;
        NavActivateFlags = NavNextActivateFlags = ImGuiActivateFlags_None;
        NavJustMovedToKeyMods = ImGuiMod_None;
        NavInputSource = ImGuiInputSource_None;
        NavLayer = ImGuiNavLayer_Main;
        NavIdIsAlive = false;
        NavMousePosDirty = false;
        NavDisableHighlight = true;
        NavDisableMouseHover = false;
        NavAnyRequest = false;
        NavInitRequest = false;
        NavInitRequestFromMove = false;
        NavInitResultId = 0;
        NavMoveSubmitted = false;
        NavMoveScoringItems = false;
        NavMoveForwardToNextFrame = false;
        NavMoveFlags = ImGuiNavMoveFlags_None;
        NavMoveScrollFlags = ImGuiScrollFlags_None;
        NavMoveKeyMods = ImGuiMod_None;
        NavMoveDir = NavMoveDirForDebug = NavMoveClipDir = ImGuiDir_None;
        NavScoringDebugCount = 0;
        NavTabbingDir = 0;
        NavTabbingCounter = 0;

        ConfigNavWindowingKeyNext = ImGuiMod_Ctrl | ImGuiKey_Tab;
        ConfigNavWindowingKeyPrev = ImGuiMod_Ctrl | ImGuiMod_Shift | ImGuiKey_Tab;
        NavWindowingTarget = NavWindowingTargetAnim = NavWindowingListWindow = NULL;
        NavWindowingTimer = NavWindowingHighlightAlpha = 0.0f;
        NavWindowingToggleLayer = false;

        DimBgRatio = 0.0f;
        MouseCursor = ImGuiMouseCursor_Arrow;

        DragDropActive = DragDropWithinSource = DragDropWithinTarget = false;
        DragDropSourceFlags = ImGuiDragDropFlags_None;
        DragDropSourceFrameCount = -1;
        DragDropMouseButton = -1;
        DragDropTargetId = 0;
        DragDropAcceptFlags = ImGuiDragDropFlags_None;
        DragDropAcceptIdCurrRectSurface = 0.0f;
        DragDropAcceptIdPrev = DragDropAcceptIdCurr = 0;
        DragDropAcceptFrameCount = -1;
        DragDropHoldJustPressedId = 0;
        memset(DragDropPayloadBufLocal, 0, sizeof(DragDropPayloadBufLocal));

        ClipperTempDataStacked = 0;

        CurrentTable = NULL;
        TablesTempDataStacked = 0;
        CurrentTabBar = NULL;

        HoverDelayId = HoverDelayIdPreviousFrame = 0;
        HoverDelayTimer = HoverDelayClearTimer = 0.0f;

        TempInputId = 0;
        ColorEditOptions = ImGuiColorEditFlags_DefaultOptions_;
        ColorEditLastHue = ColorEditLastSat = 0.0f;
        ColorEditLastColor = 0;
        SliderGrabClickOffset = 0.0f;
        SliderCurrentAccum = 0.0f;
        SliderCurrentAccumDirty = false;
        DragCurrentAccumDirty = false;
        DragCurrentAccum = 0.0f;
        DragSpeedDefaultRatio = 1.0f / 100.0f;
        ScrollbarClickDeltaToGrabCenter = 0.0f;
        DisabledAlphaBackup = 0.0f;
        DisabledStackSize = 0;
        TooltipOverrideCount = 0;

        PlatformImeData.InputPos = ImVec2(0.0f, 0.0f);
        PlatformImeDataPrev.InputPos = ImVec2(-1.0f, -1.0f); // Different to ensure initial submission
        PlatformLocaleDecimalPoint = '.';

        SettingsLoaded = false;
        SettingsDirtyTimer = 0.0f;
        HookIdNext = 0;

        memset(LocalizationTable, 0, sizeof(LocalizationTable));

        LogEnabled = false;
        LogType = ImGuiLogType_None;
        LogNextPrefix = LogNextSuffix = NULL;
        LogFile = NULL;
        LogLinePosY = FLT_MAX;
        LogLineFirstItem = false;
        LogDepthRef = 0;
        LogDepthToExpand = LogDepthToExpandDefault = 2;

        DebugLogFlags = ImGuiDebugLogFlags_OutputToTTY;
        DebugLocateId = 0;
        DebugLocateFrames = 0;
        DebugItemPickerActive = false;
        DebugItemPickerMouseButton = ImGuiMouseButton_Left;
        DebugItemPickerBreakId = 0;

        memset(FramerateSecPerFrame, 0, sizeof(FramerateSecPerFrame));
        FramerateSecPerFrameIdx = FramerateSecPerFrameCount = 0;
        FramerateSecPerFrameAccum = 0.0f;
        WantCaptureMouseNextFrame = WantCaptureKeyboardNextFrame = WantTextInputNextFrame = -1;
    }